

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void rhash_sha256_final(sha256_ctx *ctx,uchar *result)

{
  ulong uVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uStack_20;
  uint shift;
  size_t index;
  uchar *result_local;
  sha256_ctx *ctx_local;
  
  uVar1 = (ulong)(((uint)ctx->length & 0x3f) >> 2);
  sVar2 = (sbyte)(((uint)ctx->length & 3) << 3);
  ctx->message[uVar1] = (-1 << sVar2 ^ 0xffffffffU) & ctx->message[uVar1];
  uStack_20 = uVar1 + 1;
  ctx->message[uVar1] = 0x80 << sVar2 ^ ctx->message[uVar1];
  if (0xe < uStack_20) {
    while (uStack_20 < 0x10) {
      ctx->message[uStack_20] = 0;
      uStack_20 = uStack_20 + 1;
    }
    rhash_sha256_process_block(ctx->hash,ctx->message);
    uStack_20 = 0;
  }
  while (uStack_20 < 0xe) {
    ctx->message[uStack_20] = 0;
    uStack_20 = uStack_20 + 1;
  }
  uVar3 = (uint)(ctx->length >> 0x1d);
  ctx->message[0xe] =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = (uint)(ctx->length << 3);
  ctx->message[0xf] =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  rhash_sha256_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u32(result,0,ctx->hash,(ulong)ctx->digest_length);
  }
  return;
}

Assistant:

void rhash_sha256_final(sha256_ctx* ctx, unsigned char* result)
{
	size_t index = ((unsigned)ctx->length & 63) >> 2;
	unsigned shift = ((unsigned)ctx->length & 3) * 8;

	/* pad message and run for last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= le2me_32(~(0xFFFFFFFFu << shift));
	ctx->message[index++] ^= le2me_32(0x80u << shift);

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			ctx->message[index++] = 0;
		}
		rhash_sha256_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 14) {
		ctx->message[index++] = 0;
	}
	ctx->message[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	ctx->message[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha256_process_block(ctx->hash, ctx->message);

	if (result) be32_copy(result, 0, ctx->hash, ctx->digest_length);
}